

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment-map.c
# Opt level: O2

_Bool mi_is_in_heap_region(void *p)

{
  _Bool _Var1;
  mi_segmap_part_t *pmVar2;
  _Bool _Var3;
  mi_segment_t *segment;
  mi_segment_t *pmVar4;
  size_t bitidx;
  size_t index;
  uint local_28 [2];
  size_t local_20;
  
  _Var1 = _mi_arena_contains(p);
  _Var3 = true;
  if (!_Var1) {
    if (p == (void *)0x0) {
      _Var3 = false;
    }
    else {
      _Var3 = false;
      pmVar4 = (mi_segment_t *)((long)p - 1U & 0xfffffffffe000000);
      segment = (mi_segment_t *)0x0;
      if (0 < (long)pmVar4) {
        segment = pmVar4;
      }
      pmVar2 = mi_segment_map_index_of(segment,false,&local_20,(size_t *)local_28);
      if (pmVar2 != (mi_segmap_part_t *)0x0) {
        _Var3 = segment != (mi_segment_t *)0x0 &&
                (pmVar2->map[local_20] >> ((ulong)local_28[0] & 0x3f) & 1) != 0;
      }
    }
  }
  return _Var3;
}

Assistant:

bool mi_is_in_heap_region(const void* p) mi_attr_noexcept {
  return mi_is_valid_pointer(p);
}